

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O2

void __thiscall
jaegertracing::net::URI_testParseQueryValues_Test::TestBody(URI_testParseQueryValues_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long lVar1;
  bool bVar2;
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
  _Var3;
  AssertHelper *this_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  char *pcVar4;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>_>
  pVar5;
  char *nextTest2Value;
  AssertionResult gtest_ar_;
  int local_110 [2];
  AssertionResult gtest_ar;
  AssertHelper local_e8 [8];
  QueryValueMap values;
  long local_d0;
  long local_c8;
  URI uri;
  
  this_02 = (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&nextTest2Value;
  this_00 = (AssertHelper *)&nextTest2Value;
  std::__cxx11::string::string
            ((string *)&values,"http://example.com?test1=1&test2=%6F&test2=r&test3&test4",
             (allocator *)&gtest_ar);
  jaegertracing::net::URI::parse((string *)&uri);
  std::__cxx11::string::~string((string *)&values);
  jaegertracing::net::URI::parseQueryValues_abi_cxx11_();
  nextTest2Value = (char *)CONCAT44(nextTest2Value._4_4_,5);
  gtest_ar_._0_8_ = local_c8;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"5","values.size()",(int *)&nextTest2Value,
             (unsigned_long *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&nextTest2Value,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
               ,0x4e,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&nextTest2Value,(Message *)&gtest_ar_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    std::__cxx11::string::string((string *)&gtest_ar,"test1",(allocator *)&gtest_ar_);
    pVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
            ::equal_range((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                           *)&values,(key_type *)&gtest_ar);
    _Var3 = pVar5.first.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur;
    std::__cxx11::string::~string((string *)&gtest_ar);
    nextTest2Value = (char *)CONCAT44(nextTest2Value._4_4_,1);
    gtest_ar_._0_8_ =
         std::
         __distance<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>,false,true>>
                   (_Var3.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur,pVar5.second.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ._M_cur.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                   );
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&gtest_ar,"1","std::distance(test1.first, test1.second)",
               (int *)&nextTest2Value,(long *)&gtest_ar_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&nextTest2Value,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                 ,0x51,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&nextTest2Value,(Message *)&gtest_ar_);
      this_00 = (AssertHelper *)&nextTest2Value;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
                ((internal *)&gtest_ar,"\"test1\"","test1.first->first",(char (*) [6])"test1",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)_Var3.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur + 8));
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&nextTest2Value,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                   ,0x52,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&nextTest2Value,(Message *)&gtest_ar_);
        this_00 = (AssertHelper *)&nextTest2Value;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
                  ((internal *)&gtest_ar,"\"1\"","test1.first->second",(char (*) [2])0x1ebf9a,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)_Var3.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          ._M_cur + 0x28));
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&nextTest2Value,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                     ,0x53,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&nextTest2Value,(Message *)&gtest_ar_);
          this_00 = (AssertHelper *)&nextTest2Value;
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          std::__cxx11::string::string((string *)&gtest_ar,"test2",(allocator *)&gtest_ar_);
          pVar5 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                  ::equal_range((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                                 *)&values,(key_type *)&gtest_ar);
          _Var3 = pVar5.first.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  ._M_cur;
          std::__cxx11::string::~string((string *)&gtest_ar);
          nextTest2Value = (char *)CONCAT44(nextTest2Value._4_4_,2);
          gtest_ar_._0_8_ =
               std::
               __distance<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>,false,true>>
                         (_Var3.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          ._M_cur,pVar5.second.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                  ._M_cur.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                         );
          testing::internal::CmpHelperEQ<int,long>
                    ((internal *)&gtest_ar,"2","std::distance(test2.first, test2.second)",
                     (int *)&nextTest2Value,(long *)&gtest_ar_);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&nextTest2Value,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                       ,0x56,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&nextTest2Value,(Message *)&gtest_ar_);
            this_00 = (AssertHelper *)&nextTest2Value;
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
                      ((internal *)&gtest_ar,"\"test2\"","test2Itr->first",(char (*) [6])"test2",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)_Var3.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                              ._M_cur + 8));
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&nextTest2Value,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                         ,0x58,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&nextTest2Value,(Message *)&gtest_ar_);
              this_00 = (AssertHelper *)&nextTest2Value;
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)_Var3.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur + 0x28);
              bVar2 = std::operator==(__lhs,"o");
              if (!bVar2) {
                bVar2 = std::operator==(__lhs,"r");
                gtest_ar_.success_ = bVar2;
                gtest_ar_.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (bVar2) goto LAB_001bb215;
                testing::Message::Message((Message *)&nextTest2Value);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&gtest_ar,&gtest_ar_.success_,
                           "test2Itr->second == \"o\" || test2Itr->second == \"r\"","false");
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_110,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                           ,0x59,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_110,(Message *)&nextTest2Value);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_110);
                std::__cxx11::string::~string((string *)&gtest_ar);
LAB_001bb4f3:
                this_01 = &gtest_ar_.message_;
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(this_02);
                goto LAB_001bb43c;
              }
              gtest_ar_.success_ = true;
LAB_001bb215:
              gtest_ar_.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar_.message_);
              bVar2 = std::operator==(__lhs,"o");
              nextTest2Value = "r";
              if (!bVar2) {
                nextTest2Value = "o";
              }
              lVar1 = *(long *)_Var3.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                               ._M_cur;
              testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
                        ((internal *)&gtest_ar,"\"test2\"","test2Itr->first",(char (*) [6])"test2",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (lVar1 + 8));
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_110,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                           ,0x5c,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_110,(Message *)&gtest_ar_);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
                          ((internal *)&gtest_ar,"nextTest2Value","test2Itr->second",&nextTest2Value
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (lVar1 + 0x28));
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)local_110,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                             ,0x5d,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)local_110,(Message *)&gtest_ar_);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  std::__cxx11::string::string((string *)&gtest_ar,"test3",(allocator *)&gtest_ar_);
                  pVar5 = std::
                          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                          ::equal_range((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                                         *)&values,(key_type *)&gtest_ar);
                  _Var3 = pVar5.first.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          ._M_cur;
                  std::__cxx11::string::~string((string *)&gtest_ar);
                  local_110[0] = 1;
                  gtest_ar_._0_8_ =
                       std::
                       __distance<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>,false,true>>
                                 (_Var3.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                  ._M_cur,pVar5.second.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                          ._M_cur.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                 );
                  testing::internal::CmpHelperEQ<int,long>
                            ((internal *)&gtest_ar,"1","std::distance(test3.first, test3.second)",
                             local_110,(long *)&gtest_ar_);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar4 = "";
                    }
                    else {
                      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)local_110,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                               ,0x60,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)local_110,(Message *)&gtest_ar_);
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar.message_);
                    testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
                              ((internal *)&gtest_ar,"\"test3\"","test3.first->first",
                               (char (*) [6])"test3",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)_Var3.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                      ._M_cur + 8));
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&gtest_ar_);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar4 = "";
                      }
                      else {
                        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)local_110,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                                 ,0x61,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)local_110,(Message *)&gtest_ar_);
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(&gtest_ar.message_);
                      gtest_ar_.message_.ptr_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                      bVar2 = *(long *)((long)_Var3.
                                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                              ._M_cur + 0x30) == 0;
                      gtest_ar_.success_ = bVar2;
                      if (!bVar2) {
                        testing::Message::Message((Message *)local_110);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  (&gtest_ar,&gtest_ar_.success_,"test3.first->second.empty()",
                                   "false");
                        testing::internal::AssertHelper::AssertHelper
                                  (local_e8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                                   ,0x62,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                        testing::internal::AssertHelper::operator=(local_e8,(Message *)local_110);
LAB_001bb3db:
                        testing::internal::AssertHelper::~AssertHelper(local_e8);
                        std::__cxx11::string::~string((string *)&gtest_ar);
                        this_02 = (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_110;
                        goto LAB_001bb4f3;
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(&gtest_ar_.message_);
                      std::__cxx11::string::string
                                ((string *)&gtest_ar,"test4",(allocator *)&gtest_ar_);
                      pVar5 = std::
                              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                              ::equal_range((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                                             *)&values,(key_type *)&gtest_ar);
                      _Var3 = pVar5.first.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                              ._M_cur;
                      std::__cxx11::string::~string((string *)&gtest_ar);
                      local_110[0] = 1;
                      gtest_ar_._0_8_ =
                           std::
                           __distance<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>,false,true>>
                                     (_Var3.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                      ._M_cur,pVar5.second.
                                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                              ._M_cur.
                                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                     );
                      testing::internal::CmpHelperEQ<int,long>
                                ((internal *)&gtest_ar,"1",
                                 "std::distance(test4.first, test4.second)",local_110,
                                 (long *)&gtest_ar_);
                      if (gtest_ar.success_ == false) {
                        testing::Message::Message((Message *)&gtest_ar_);
                        if (gtest_ar.message_.ptr_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar4 = "";
                        }
                        else {
                          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)local_110,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                                   ,0x65,pcVar4);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)local_110,(Message *)&gtest_ar_);
                      }
                      else {
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr(&gtest_ar.message_);
                        testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
                                  ((internal *)&gtest_ar,"\"test4\"","test4.first->first",
                                   (char (*) [6])0x1e9f1b,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)_Var3.
                                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                             ._M_cur + 8));
                        if (gtest_ar.success_ != false) {
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr(&gtest_ar.message_);
                          gtest_ar_.message_.ptr_ =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0;
                          bVar2 = *(long *)((long)_Var3.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                                  ._M_cur + 0x30) == 0;
                          gtest_ar_.success_ = bVar2;
                          if (bVar2) {
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr(&gtest_ar_.message_);
                            std::
                            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                                           *)&values);
                            URI::~URI(&uri);
                            std::__cxx11::string::string
                                      ((string *)&gtest_ar,"http://example.com",
                                       (allocator *)&nextTest2Value);
                            jaegertracing::net::URI::parse((string *)&uri);
                            jaegertracing::net::URI::parseQueryValues_abi_cxx11_();
                            gtest_ar_.success_ = local_c8 == 0;
                            gtest_ar_.message_.ptr_ =
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                            std::
                            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                                           *)&values);
                            URI::~URI(&uri);
                            std::__cxx11::string::~string((string *)&gtest_ar);
                            if (gtest_ar_.success_ == false) {
                              testing::Message::Message((Message *)&values);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((AssertionResult *)&uri,&gtest_ar_.success_,
                                         "URI::parse(\"http://example.com\").parseQueryValues().empty()"
                                         ,"false");
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                                         ,0x6a,_uri);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar,(Message *)&values);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar);
                              std::__cxx11::string::~string((string *)&uri);
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)&values);
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr(&gtest_ar_.message_);
                              return;
                            }
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr(&gtest_ar_.message_);
                            std::__cxx11::string::string
                                      ((string *)&values,"http://example.com?key=value",
                                       (allocator *)&gtest_ar);
                            jaegertracing::net::URI::parse((string *)&uri);
                            std::__cxx11::string::~string((string *)&values);
                            jaegertracing::net::URI::parseQueryValues_abi_cxx11_();
                            nextTest2Value = (char *)CONCAT44(nextTest2Value._4_4_,1);
                            gtest_ar_._0_8_ = local_c8;
                            testing::internal::CmpHelperEQ<int,unsigned_long>
                                      ((internal *)&gtest_ar,"1","values.size()",
                                       (int *)&nextTest2Value,(unsigned_long *)&gtest_ar_);
                            if (gtest_ar.success_ == false) {
                              testing::Message::Message((Message *)&gtest_ar_);
                              if (gtest_ar.message_.ptr_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar4 = "";
                              }
                              else {
                                pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&nextTest2Value,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                                         ,0x6f,pcVar4);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&nextTest2Value,(Message *)&gtest_ar_);
                              this_00 = (AssertHelper *)&nextTest2Value;
                            }
                            else {
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr(&gtest_ar.message_);
                              testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
                                        ((internal *)&gtest_ar,"\"key\"","std::begin(values)->first"
                                         ,(char (*) [4])0x1ef495,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(local_d0 + 8));
                              if (gtest_ar.success_ != false) {
                                testing::internal::
                                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~scoped_ptr(&gtest_ar.message_);
                                testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
                                          ((internal *)&gtest_ar,"\"value\"",
                                           "std::begin(values)->second",(char (*) [6])0x1e5c41,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(local_d0 + 0x28));
                                if (gtest_ar.success_ == false) {
                                  testing::Message::Message((Message *)&gtest_ar_);
                                  if (gtest_ar.message_.ptr_ ==
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    pcVar4 = "";
                                  }
                                  else {
                                    pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&nextTest2Value,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                                             ,0x71,pcVar4);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&nextTest2Value,(Message *)&gtest_ar_);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&nextTest2Value);
                                  testing::internal::
                                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 *)&gtest_ar_);
                                }
                                this_01 = &gtest_ar.message_;
                                goto LAB_001bb43c;
                              }
                              testing::Message::Message((Message *)&gtest_ar_);
                              if (gtest_ar.message_.ptr_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar4 = "";
                              }
                              else {
                                pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&nextTest2Value,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                                         ,0x70,pcVar4);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&nextTest2Value,(Message *)&gtest_ar_);
                              this_00 = (AssertHelper *)&nextTest2Value;
                            }
                            goto LAB_001bb42a;
                          }
                          testing::Message::Message((Message *)local_110);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    (&gtest_ar,&gtest_ar_.success_,"test4.first->second.empty()",
                                     "false");
                          testing::internal::AssertHelper::AssertHelper
                                    (local_e8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                                     ,0x67,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                          testing::internal::AssertHelper::operator=(local_e8,(Message *)local_110);
                          goto LAB_001bb3db;
                        }
                        testing::Message::Message((Message *)&gtest_ar_);
                        if (gtest_ar.message_.ptr_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar4 = "";
                        }
                        else {
                          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)local_110,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                                   ,0x66,pcVar4);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)local_110,(Message *)&gtest_ar_);
                      }
                    }
                  }
                }
              }
              this_00 = (AssertHelper *)local_110;
            }
          }
        }
      }
    }
  }
LAB_001bb42a:
  this_01 = &gtest_ar.message_;
  testing::internal::AssertHelper::~AssertHelper(this_00);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
LAB_001bb43c:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_01);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                 *)&values);
  URI::~URI(&uri);
  return;
}

Assistant:

TEST(URI, testParseQueryValues)
{
    {
        const auto uri = URI::parse(
            "http://example.com?test1=1&test2=%6F&test2=r&test3&test4");
        const auto values = uri.parseQueryValues();
        ASSERT_EQ(5, values.size());

        const auto test1 = values.equal_range("test1");
        ASSERT_EQ(1, std::distance(test1.first, test1.second));
        ASSERT_EQ("test1", test1.first->first);
        ASSERT_EQ("1", test1.first->second);

        const auto test2 = values.equal_range("test2");
        ASSERT_EQ(2, std::distance(test2.first, test2.second));
        auto test2Itr = test2.first;
        ASSERT_EQ("test2", test2Itr->first);
        ASSERT_TRUE(test2Itr->second == "o" || test2Itr->second == "r");
        auto nextTest2Value = (test2Itr->second == "o") ? "r" : "o";
        ++test2Itr;
        ASSERT_EQ("test2", test2Itr->first);
        ASSERT_EQ(nextTest2Value, test2Itr->second);

        const auto test3 = values.equal_range("test3");
        ASSERT_EQ(1, std::distance(test3.first, test3.second));
        ASSERT_EQ("test3", test3.first->first);
        ASSERT_TRUE(test3.first->second.empty());

        const auto test4 = values.equal_range("test4");
        ASSERT_EQ(1, std::distance(test4.first, test4.second));
        ASSERT_EQ("test4", test4.first->first);
        ASSERT_TRUE(test4.first->second.empty());
    }

    ASSERT_TRUE(URI::parse("http://example.com").parseQueryValues().empty());

    {
        const auto uri = URI::parse("http://example.com?key=value");
        const auto values = uri.parseQueryValues();
        ASSERT_EQ(1, values.size());
        ASSERT_EQ("key", std::begin(values)->first);
        ASSERT_EQ("value", std::begin(values)->second);
    }
}